

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O0

addr_type __thiscall
LdConfigDirWrapper::containsAddrType(LdConfigDirWrapper *this,size_t fieldId,size_t subField)

{
  size_t subField_local;
  size_t fieldId_local;
  LdConfigDirWrapper *this_local;
  
  if ((((((fieldId == 9) || (fieldId - 0x10 < 3)) || (fieldId - 0x14 < 3)) ||
       ((fieldId == 0x1d || (fieldId == 0x1f)))) ||
      ((fieldId == 0x21 || ((fieldId - 0x23 < 2 || (fieldId == 0x28)))))) || (fieldId - 0x2b < 3)) {
    this_local._4_4_ = VA;
  }
  else {
    this_local._4_4_ = NOT_ADDR;
  }
  return this_local._4_4_;
}

Assistant:

Executable::addr_type LdConfigDirWrapper::containsAddrType(size_t fieldId, size_t subField)
{
    switch (fieldId) {
        case LOCK_PREFIX :
        case EDIT_LIST :
        case SEC_COOKIE :
        case SEH_TABLE :
        case GUARD_CHECK :
        case GUARD_DISPATCH :
        case GUARD_TABLE :
        case GUARD_ADDR_IAT_ENTRY_TABLE:
        case GUARD_LONG_JUMP_TABLE:
        case DYNAMIC_VAL_RELOC:
        case GUARD_FAILURE_ROUTINE:
        case GUARD_FAILURE_ROUTINE_FUNC_PTR:
        case GUARD_VERIFY_STACK_PTR:
        case ENCLAVE_CONFIG_PTR:
        case VOLATILE_METADATA_PTR:
        case GUARD_EH_CONT_TABLE:
            return Executable::VA;
    }
    return Executable::NOT_ADDR;
}